

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O0

Status __thiscall leveldb::WriteBatch::Iterate(WriteBatch *this,Handler *handler)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t in_RDX;
  Slice local_f8;
  Slice local_e8;
  Slice local_d8;
  Slice local_c8;
  Slice local_b8;
  Slice local_a8;
  Slice local_98;
  Slice local_88;
  char local_75;
  int local_74;
  undefined1 local_70 [3];
  char tag;
  int found;
  Slice value;
  Slice key;
  Slice local_40;
  undefined1 local_30 [8];
  Slice input;
  Handler *handler_local;
  WriteBatch *this_local;
  
  input.size_ = in_RDX;
  Slice::Slice((Slice *)local_30,(string *)handler);
  sVar4 = Slice::size((Slice *)local_30);
  if (sVar4 < 0xc) {
    Slice::Slice(&local_40,"malformed WriteBatch (too small)");
    Slice::Slice((Slice *)&key.size_);
    Status::Corruption((Status *)this,&local_40,(Slice *)&key.size_);
  }
  else {
    Slice::remove_prefix((Slice *)local_30,0xc);
    Slice::Slice((Slice *)&value.size_);
    Slice::Slice((Slice *)local_70);
    local_74 = 0;
    while (bVar2 = Slice::empty((Slice *)local_30), iVar1 = local_74, ((bVar2 ^ 0xffU) & 1) != 0) {
      local_74 = local_74 + 1;
      local_75 = Slice::operator[]((Slice *)local_30,0);
      Slice::remove_prefix((Slice *)local_30,1);
      if (local_75 == '\0') {
        bVar2 = GetLengthPrefixedSlice((Slice *)local_30,(Slice *)&value.size_);
        if (!bVar2) {
          Slice::Slice(&local_a8,"bad WriteBatch Delete");
          Slice::Slice(&local_b8);
          Status::Corruption((Status *)this,&local_a8,&local_b8);
          return (Status)(char *)this;
        }
        (**(code **)(*(long *)input.size_ + 0x18))(input.size_,&value.size_);
      }
      else {
        if (local_75 != '\x01') {
          Slice::Slice(&local_c8,"unknown WriteBatch tag");
          Slice::Slice(&local_d8);
          Status::Corruption((Status *)this,&local_c8,&local_d8);
          return (Status)(char *)this;
        }
        bVar2 = GetLengthPrefixedSlice((Slice *)local_30,(Slice *)&value.size_);
        if ((!bVar2) ||
           (bVar2 = GetLengthPrefixedSlice((Slice *)local_30,(Slice *)local_70), !bVar2)) {
          Slice::Slice(&local_88,"bad WriteBatch Put");
          Slice::Slice(&local_98);
          Status::Corruption((Status *)this,&local_88,&local_98);
          return (Status)(char *)this;
        }
        (**(code **)(*(long *)input.size_ + 0x10))(input.size_,&value.size_,local_70);
      }
    }
    iVar3 = WriteBatchInternal::Count((WriteBatch *)handler);
    if (iVar1 == iVar3) {
      Status::OK();
    }
    else {
      Slice::Slice(&local_e8,"WriteBatch has wrong count");
      Slice::Slice(&local_f8);
      Status::Corruption((Status *)this,&local_e8,&local_f8);
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status WriteBatch::Iterate(Handler* handler) const {
  Slice input(rep_);
  if (input.size() < kHeader) {
    return Status::Corruption("malformed WriteBatch (too small)");
  }

  input.remove_prefix(kHeader);
  Slice key, value;
  int found = 0;
  while (!input.empty()) {
    found++;
    char tag = input[0];
    input.remove_prefix(1);
    switch (tag) {
      case kTypeValue:
        if (GetLengthPrefixedSlice(&input, &key) &&
            GetLengthPrefixedSlice(&input, &value)) {
          handler->Put(key, value);
        } else {
          return Status::Corruption("bad WriteBatch Put");
        }
        break;
      case kTypeDeletion:
        if (GetLengthPrefixedSlice(&input, &key)) {
          handler->Delete(key);
        } else {
          return Status::Corruption("bad WriteBatch Delete");
        }
        break;
      default:
        return Status::Corruption("unknown WriteBatch tag");
    }
  }
  if (found != WriteBatchInternal::Count(this)) {
    return Status::Corruption("WriteBatch has wrong count");
  } else {
    return Status::OK();
  }
}